

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

Map * new_map(uint size)

{
  ulong uVar1;
  uint uVar2;
  Map *pMVar3;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  uint i;
  uint uVar7;
  ulong uVar8;
  
  pMVar3 = (Map *)malloc(0x18);
  uVar8 = 0xb;
  if (size != 0) {
    uVar8 = (ulong)size;
  }
  pMVar3->size = 0;
  pMVar3->capacity = (uint)uVar8;
  ppvVar4 = (void **)malloc(uVar8 * 0x18);
  pMVar3->elem = ppvVar4;
  while (uVar7 = (uint)uVar8, uVar5 = 1, 2 < uVar7) {
    if ((uVar8 & 1) != 0) {
      uVar6 = 3;
      do {
        uVar5 = uVar7;
        if (uVar7 == uVar6) goto LAB_00103a67;
        uVar1 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while ((int)(uVar8 % uVar1) != 0);
    }
    uVar8 = (ulong)(uVar7 - 1);
  }
LAB_00103a67:
  uVar2 = 2;
  if (2 < uVar5) {
    uVar2 = uVar5;
  }
  pMVar3->prime = uVar2;
  return pMVar3;
}

Assistant:

Map *new_map(unsigned int size) {
    Map *map = malloc(sizeof(Map));
    map->size = 0;
    map->capacity = size ? size : 11;
    map->elem = malloc(sizeof(List) * map->capacity);
    map->prime = get_max_prime(map->capacity);
    return map;
}